

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktClippingTests.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::clipping::anon_unknown_0::ClipDistance::testClipDistance
          (TestStatus *__return_storage_ptr__,ClipDistance *this,Context *context,
          CaseDefinition caseDef)

{
  UVec2 *this_00;
  DrawState *this_01;
  ProgramCollection<vk::ProgramBinary> *pPVar1;
  uint uVar2;
  FeatureFlags flags;
  int iVar3;
  InstanceInterface *vk;
  VkPhysicalDevice physicalDevice;
  ulong uVar4;
  TestLog *pTVar5;
  VkPrimitiveTopology VVar6;
  int i;
  int iVar7;
  int iVar8;
  float fVar9;
  float fVar10;
  vector<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_> shaders;
  IVec2 clipRegion;
  VulkanProgram vulkanProgram;
  DrawCallData drawCallData;
  Vector<float,_4> local_6f8;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> vertices;
  IVec2 local_6c8;
  VulkanDrawContext drawContext;
  uint local_3ec;
  uint local_3e8;
  uint local_3e4;
  undefined1 local_388 [8];
  ProgramBinary *pPStack_380;
  ConstPixelBufferAccess local_200;
  ConstPixelBufferAccess local_1d8;
  DrawState drawState;
  
  vk = Context::getInstanceInterface((Context *)this);
  physicalDevice = Context::getPhysicalDevice((Context *)this);
  ::vk::getPhysicalDeviceProperties((VkPhysicalDeviceProperties *)&drawContext,vk,physicalDevice);
  VVar6 = caseDef.topology;
  iVar3 = (uint)(0 < (int)VVar6) * 0x200;
  iVar7 = caseDef._4_4_;
  iVar8 = iVar3 + 0x400;
  if (iVar7 == 0 || caseDef._0_8_ < 0) {
    iVar8 = iVar3;
  }
  uVar4 = (ulong)context & 0x10000000000;
  uVar2 = (uint)(uVar4 >> 0x20);
  flags = iVar8 + 2 + (uVar2 >> 8);
  if (((ulong)context >> 0x30 & 1) == 0) {
    flags = iVar8 + (uVar2 >> 8);
  }
  requireFeatures(vk,physicalDevice,flags);
  if (((int)VVar6 < 1) || (7 < local_3ec)) {
    if ((iVar7 == 0 || caseDef._0_8_ < 0) || (7 < local_3e8)) {
      if ((iVar7 < 1) || (7 < local_3e4)) {
        shaders.super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        shaders.super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        shaders.super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pPVar1 = *(ProgramCollection<vk::ProgramBinary> **)(this + 0x10);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&drawContext,"vert",(allocator<char> *)&drawState);
        pPStack_380 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar1,(string *)&drawContext)
        ;
        local_388._0_4_ = 1.4013e-45;
        std::vector<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>::
        emplace_back<vkt::drawutil::Shader>(&shaders,(Shader *)local_388);
        std::__cxx11::string::~string((string *)&drawContext);
        pPVar1 = *(ProgramCollection<vk::ProgramBinary> **)(this + 0x10);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&drawContext,"frag",(allocator<char> *)&drawState);
        pPStack_380 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar1,(string *)&drawContext)
        ;
        local_388._0_4_ = 2.24208e-44;
        std::vector<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>::
        emplace_back<vkt::drawutil::Shader>(&shaders,(Shader *)local_388);
        std::__cxx11::string::~string((string *)&drawContext);
        if (uVar4 != 0) {
          pPVar1 = *(ProgramCollection<vk::ProgramBinary> **)(this + 0x10);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&drawContext,"tesc",(allocator<char> *)&drawState);
          pPStack_380 = ::vk::ProgramCollection<vk::ProgramBinary>::get
                                  (pPVar1,(string *)&drawContext);
          local_388._0_4_ = 2.8026e-45;
          std::vector<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>::
          emplace_back<vkt::drawutil::Shader>(&shaders,(Shader *)local_388);
          std::__cxx11::string::~string((string *)&drawContext);
          pPVar1 = *(ProgramCollection<vk::ProgramBinary> **)(this + 0x10);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&drawContext,"tese",(allocator<char> *)&drawState);
          pPStack_380 = ::vk::ProgramCollection<vk::ProgramBinary>::get
                                  (pPVar1,(string *)&drawContext);
          local_388._0_4_ = 5.60519e-45;
          std::vector<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>::
          emplace_back<vkt::drawutil::Shader>(&shaders,(Shader *)local_388);
          std::__cxx11::string::~string((string *)&drawContext);
        }
        if (((ulong)context >> 0x30 & 1) != 0) {
          pPVar1 = *(ProgramCollection<vk::ProgramBinary> **)(this + 0x10);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&drawContext,"geom",(allocator<char> *)&drawState);
          pPStack_380 = ::vk::ProgramCollection<vk::ProgramBinary>::get
                                  (pPVar1,(string *)&drawContext);
          local_388._0_4_ = 1.12104e-44;
          std::vector<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>::
          emplace_back<vkt::drawutil::Shader>(&shaders,(Shader *)local_388);
          std::__cxx11::string::~string((string *)&drawContext);
        }
        vertices.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        vertices.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        vertices.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        for (iVar8 = 0; iVar8 != 8; iVar8 = iVar8 + 1) {
          fVar9 = (float)iVar8 * 0.25 + -1.0;
          drawContext.super_DrawContext._vptr_DrawContext._4_4_ = 0xbf800000;
          drawContext.super_DrawContext.m_drawState.topology = VK_PRIMITIVE_TOPOLOGY_POINT_LIST;
          drawContext.super_DrawContext.m_drawState.colorFormat = 0x3f800000;
          drawContext.super_DrawContext._vptr_DrawContext._0_4_ = fVar9;
          std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
          emplace_back<tcu::Vector<float,4>>
                    ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)&vertices,
                     (Vector<float,_4> *)&drawContext);
          drawContext.super_DrawContext._vptr_DrawContext._4_4_ = 0x3f800000;
          drawContext.super_DrawContext.m_drawState.topology = VK_PRIMITIVE_TOPOLOGY_POINT_LIST;
          drawContext.super_DrawContext.m_drawState.colorFormat = 0x3f800000;
          drawContext.super_DrawContext._vptr_DrawContext._0_4_ = fVar9;
          std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
          emplace_back<tcu::Vector<float,4>>
                    ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)&vertices,
                     (Vector<float,_4> *)&drawContext);
          fVar10 = fVar9 + 0.25;
          drawContext.super_DrawContext._vptr_DrawContext._4_4_ = 0xbf800000;
          drawContext.super_DrawContext.m_drawState.topology = VK_PRIMITIVE_TOPOLOGY_POINT_LIST;
          drawContext.super_DrawContext.m_drawState.colorFormat = 0x3f800000;
          drawContext.super_DrawContext._vptr_DrawContext._0_4_ = fVar10;
          std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
          emplace_back<tcu::Vector<float,4>>
                    ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)&vertices,
                     (Vector<float,_4> *)&drawContext);
          drawContext.super_DrawContext._vptr_DrawContext._4_4_ = 0x3f800000;
          drawContext.super_DrawContext.m_drawState.topology = VK_PRIMITIVE_TOPOLOGY_POINT_LIST;
          drawContext.super_DrawContext.m_drawState.colorFormat = 0x3f800000;
          drawContext.super_DrawContext._vptr_DrawContext._0_4_ = fVar9;
          std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
          emplace_back<tcu::Vector<float,4>>
                    ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)&vertices,
                     (Vector<float,_4> *)&drawContext);
          drawContext.super_DrawContext._vptr_DrawContext._4_4_ = 0x3f800000;
          drawContext.super_DrawContext.m_drawState.topology = VK_PRIMITIVE_TOPOLOGY_POINT_LIST;
          drawContext.super_DrawContext.m_drawState.colorFormat = 0x3f800000;
          drawContext.super_DrawContext._vptr_DrawContext._0_4_ = fVar10;
          std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
          emplace_back<tcu::Vector<float,4>>
                    ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)&vertices,
                     (Vector<float,_4> *)&drawContext);
          drawContext.super_DrawContext._vptr_DrawContext._4_4_ = 0xbf800000;
          drawContext.super_DrawContext.m_drawState.topology = VK_PRIMITIVE_TOPOLOGY_POINT_LIST;
          drawContext.super_DrawContext.m_drawState.colorFormat = 0x3f800000;
          drawContext.super_DrawContext._vptr_DrawContext._0_4_ = fVar10;
          std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
          emplace_back<tcu::Vector<float,4>>
                    ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)&vertices,
                     (Vector<float,_4> *)&drawContext);
        }
        drawState._0_8_ = *(undefined8 *)(*(long *)this + 0x10);
        this_00 = &drawState.renderSize;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
        std::operator<<((ostream *)this_00,"Drawing ");
        std::ostream::operator<<(this_00,8);
        std::operator<<((ostream *)this_00," colored bars, clipping the first ");
        std::ostream::operator<<(this_00,VVar6);
        local_388 = (undefined1  [8])
                    tcu::MessageBuilder::operator<<
                              ((MessageBuilder *)&drawState,
                               (EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&pPStack_380);
        std::operator<<((ostream *)&pPStack_380,"Using ");
        std::ostream::operator<<((ostringstream *)&pPStack_380,VVar6);
        std::operator<<((ostream *)&pPStack_380," ClipDistance(s) and ");
        std::ostream::operator<<((ostringstream *)&pPStack_380,iVar7);
        std::operator<<((ostream *)&pPStack_380," CullDistance(s)");
        pTVar5 = tcu::MessageBuilder::operator<<
                           ((MessageBuilder *)local_388,(EndMessageToken *)&tcu::TestLog::EndMessage
                           );
        this_01 = &drawContext.super_DrawContext.m_drawState;
        drawContext.super_DrawContext._vptr_DrawContext._0_4_ = SUB84(pTVar5,0);
        drawContext.super_DrawContext._vptr_DrawContext._4_4_ = (undefined4)((ulong)pTVar5 >> 0x20);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)this_01);
        std::operator<<((ostream *)this_01,"Expecting upper half of the clipped bars to be black.");
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)&drawContext,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_01);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pPStack_380);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
        drawutil::DrawState::DrawState(&drawState,(VkPrimitiveTopology)context,0x10,0x10);
        vulkanProgram.shaders = &shaders;
        if (uVar4 != 0) {
          drawState.numPatchControlPoints = 3;
        }
        drawCallData.vertices = &vertices;
        drawutil::VulkanDrawContext::VulkanDrawContext
                  (&drawContext,(Context *)this,&drawState,&drawCallData,&vulkanProgram);
        drawutil::VulkanDrawContext::draw(&drawContext);
        drawutil::VulkanDrawContext::getColorPixels(&local_1d8,&drawContext);
        local_388 = (undefined1  [8])0x0;
        pPStack_380 = (ProgramBinary *)0x3f80000000000000;
        tcu::Vector<float,_4>::Vector(&local_6f8);
        iVar8 = countPixels(&local_1d8,(Vec4 *)local_388,&local_6f8);
        clipRegion.m_data[0] = (int)(VVar6 * 0x10) >> 3;
        clipRegion.m_data[1] = 8;
        drawutil::VulkanDrawContext::getColorPixels(&local_200,&drawContext);
        local_6c8.m_data[0] = 0;
        local_6c8.m_data[1] = 8;
        local_388 = (undefined1  [8])0x0;
        pPStack_380 = (ProgramBinary *)0x3f80000000000000;
        tcu::Vector<float,_4>::Vector(&local_6f8);
        iVar3 = countPixels(&local_200,&local_6c8,&clipRegion,(Vec4 *)local_388,&local_6f8);
        if ((iVar8 == VVar6 * 0x10) && (iVar3 == 0)) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_388,"OK",(allocator<char> *)&local_6f8);
          tcu::TestStatus::pass(__return_storage_ptr__,(string *)local_388);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_388,"Rendered image(s) are incorrect",
                     (allocator<char> *)&local_6f8);
          tcu::TestStatus::fail(__return_storage_ptr__,(string *)local_388);
        }
        std::__cxx11::string::~string((string *)local_388);
        drawutil::VulkanDrawContext::~VulkanDrawContext(&drawContext);
        std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
        ~_Vector_base(&vertices.
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     );
        std::_Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>::
        ~_Vector_base(&shaders.
                       super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>
                     );
        return __return_storage_ptr__;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&drawContext,
                 "maxCombinedClipAndCullDistances smaller than the minimum required by the spec",
                 (allocator<char> *)local_388);
      tcu::TestStatus::fail(__return_storage_ptr__,(string *)&drawContext);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&drawContext,
                 "maxCullDistances smaller than the minimum required by the spec",
                 (allocator<char> *)local_388);
      tcu::TestStatus::fail(__return_storage_ptr__,(string *)&drawContext);
    }
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&drawContext,
               "maxClipDistances smaller than the minimum required by the spec",
               (allocator<char> *)local_388);
    tcu::TestStatus::fail(__return_storage_ptr__,(string *)&drawContext);
  }
  std::__cxx11::string::~string((string *)&drawContext);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus testClipDistance (Context& context, const CaseDefinition caseDef)
{
	// Check test requirements
	{
		const InstanceInterface&		vki			= context.getInstanceInterface();
		const VkPhysicalDevice			physDevice	= context.getPhysicalDevice();
		const VkPhysicalDeviceLimits	limits		= getPhysicalDeviceProperties(vki, physDevice).limits;

		FeatureFlags requirements = (FeatureFlags)0;

		if (caseDef.numClipDistances > 0)
			requirements |= FEATURE_SHADER_CLIP_DISTANCE;
		if (caseDef.numCullDistances > 0)
			requirements |= FEATURE_SHADER_CULL_DISTANCE;
		if (caseDef.enableTessellation)
			requirements |= FEATURE_TESSELLATION_SHADER;
		if (caseDef.enableGeometry)
			requirements |= FEATURE_GEOMETRY_SHADER;

		requireFeatures(vki, physDevice, requirements);

		// Check limits for supported features

		if (caseDef.numClipDistances > 0 && limits.maxClipDistances < MAX_CLIP_DISTANCES)
			return tcu::TestStatus::fail("maxClipDistances smaller than the minimum required by the spec");
		if (caseDef.numCullDistances > 0 && limits.maxCullDistances < MAX_CULL_DISTANCES)
			return tcu::TestStatus::fail("maxCullDistances smaller than the minimum required by the spec");
		if (caseDef.numCullDistances > 0 && limits.maxCombinedClipAndCullDistances < MAX_COMBINED_CLIP_AND_CULL_DISTANCES)
			return tcu::TestStatus::fail("maxCombinedClipAndCullDistances smaller than the minimum required by the spec");
	}

	std::vector<Shader> shaders;
	shaders.push_back(Shader(VK_SHADER_STAGE_VERTEX_BIT,	context.getBinaryCollection().get("vert")));
	shaders.push_back(Shader(VK_SHADER_STAGE_FRAGMENT_BIT,	context.getBinaryCollection().get("frag")));
	if (caseDef.enableTessellation)
	{
		shaders.push_back(Shader(VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT,		context.getBinaryCollection().get("tesc")));
		shaders.push_back(Shader(VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT,	context.getBinaryCollection().get("tese")));
	}
	if (caseDef.enableGeometry)
		shaders.push_back(Shader(VK_SHADER_STAGE_GEOMETRY_BIT,	context.getBinaryCollection().get("geom")));

	const int numBars = MAX_COMBINED_CLIP_AND_CULL_DISTANCES;

	std::vector<Vec4> vertices;
	{
		const float	dx = 2.0f / numBars;
		for (int i = 0; i < numBars; ++i)
		{
			const float x = -1.0f + dx * static_cast<float>(i);

			vertices.push_back(Vec4(x,      -1.0f, 0.0f, 1.0f));
			vertices.push_back(Vec4(x,       1.0f, 0.0f, 1.0f));
			vertices.push_back(Vec4(x + dx, -1.0f, 0.0f, 1.0f));

			vertices.push_back(Vec4(x,       1.0f, 0.0f, 1.0f));
			vertices.push_back(Vec4(x + dx,  1.0f, 0.0f, 1.0f));
			vertices.push_back(Vec4(x + dx, -1.0f, 0.0f, 1.0f));
		}
	}

	tcu::TestLog& log = context.getTestContext().getLog();

	log << tcu::TestLog::Message << "Drawing " << numBars << " colored bars, clipping the first " << caseDef.numClipDistances << tcu::TestLog::EndMessage
		<< tcu::TestLog::Message << "Using " << caseDef.numClipDistances << " ClipDistance(s) and " << caseDef.numCullDistances << " CullDistance(s)" << tcu::TestLog::EndMessage
		<< tcu::TestLog::Message << "Expecting upper half of the clipped bars to be black." << tcu::TestLog::EndMessage;

	DrawState			drawState		(caseDef.topology, RENDER_SIZE, RENDER_SIZE);
	DrawCallData		drawCallData	(vertices);
	VulkanProgram		vulkanProgram	(shaders);

	if (caseDef.enableTessellation)
		drawState.numPatchControlPoints = NUM_PATCH_CONTROL_POINTS;

	VulkanDrawContext	drawContext(context, drawState, drawCallData, vulkanProgram);
	drawContext.draw();

	// Count black pixels in the whole image.
	const int numBlackPixels		= countPixels(drawContext.getColorPixels(), Vec4(0.0f, 0.0f, 0.0f, 1.0f), Vec4());
	const IVec2	clipRegion			= IVec2(caseDef.numClipDistances * RENDER_SIZE / numBars, RENDER_SIZE / 2);
	const int expectedClippedPixels	= clipRegion.x() * clipRegion.y();
	// Make sure the bottom half has no black pixels (possible if image became corrupted).
	const int guardPixels			= countPixels(drawContext.getColorPixels(), IVec2(0, RENDER_SIZE/2), clipRegion, Vec4(0.0f, 0.0f, 0.0f, 1.0f), Vec4());

	return (numBlackPixels == expectedClippedPixels && guardPixels == 0 ? tcu::TestStatus::pass("OK")
																		: tcu::TestStatus::fail("Rendered image(s) are incorrect"));
}